

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_rem_arm(float32 a,float32 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  byte bVar7;
  bool bVar8;
  float32 fVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      a = a & 0x80000000;
    }
    if ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      b = b & 0x80000000;
    }
  }
  uVar18 = a & 0x7fffff;
  uVar14 = a >> 0x17 & 0xff;
  uVar17 = b & 0x7fffff;
  uVar11 = b >> 0x17;
  uVar16 = uVar11 & 0xff;
  if (uVar14 == 0xff) {
    if ((uVar18 == 0) && (uVar17 == 0 || uVar16 != 0xff)) {
LAB_00554e4a:
      status->float_exception_flags = status->float_exception_flags | 1;
      return 0x7fc00000;
    }
LAB_00554d8f:
    fVar9 = propagateFloat32NaN(a,b,status);
    return fVar9;
  }
  if ((char)uVar11 == '\0') {
    if (uVar17 == 0) goto LAB_00554e4a;
    uVar11 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar17 = uVar17 << ((char)(uVar11 ^ 0x1f) - 8U & 0x1f);
    uVar16 = 9 - (uVar11 ^ 0x1f);
  }
  else if ((uVar11 & 0xff) == 0xff) {
    if (uVar17 == 0) {
      return a;
    }
    goto LAB_00554d8f;
  }
  if (uVar14 == 0) {
    if (uVar18 == 0) {
      return a;
    }
    uVar11 = 0x1f;
    if (uVar18 != 0) {
      for (; uVar18 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar18 = uVar18 << ((char)(uVar11 ^ 0x1f) - 8U & 0x1f);
    uVar14 = 9 - (uVar11 ^ 0x1f);
  }
  uVar11 = uVar14 - uVar16;
  uVar18 = uVar18 | 0x800000;
  uVar17 = uVar17 | 0x800000;
  if ((int)uVar11 < 0x20) {
    uVar18 = uVar18 * 0x100;
    uVar17 = uVar17 << 8;
    if ((int)uVar11 < 0) {
      if (uVar11 != 0xffffffff) {
        return a;
      }
      uVar18 = uVar18 >> 1;
      bVar8 = false;
    }
    else {
      uVar5 = 0;
      if (uVar17 <= uVar18) {
        uVar5 = uVar17;
      }
      bVar8 = uVar17 <= uVar18;
      uVar18 = uVar18 - uVar5;
      if (uVar14 != uVar16) {
        uVar14 = SUB164((ZEXT416(uVar18) << 0x20) / ZEXT416(uVar17),0) >> (-(char)uVar11 & 0x1fU);
        uVar17 = uVar17 >> 2;
        uVar18 = ((uVar18 >> 1) << ((char)uVar11 - 1U & 0x1f)) - uVar14 * uVar17;
        goto LAB_00554fbb;
      }
    }
    uVar14 = (uint)bVar8;
    uVar18 = uVar18 >> 2;
    uVar17 = uVar17 >> 2;
  }
  else {
    uVar14 = 0;
    if (uVar17 <= uVar18) {
      uVar14 = uVar17;
    }
    uVar12 = 0xffffffff;
    uVar19 = (ulong)(uVar18 - uVar14) << 0x28;
    uVar15 = (ulong)uVar17 << 0x28;
    iVar21 = uVar11 - 0x40;
    if (0x40 < uVar11) {
      uVar23 = uVar15 >> 0x20;
      iVar6 = iVar21;
      do {
        uVar10 = 0xffffffffffffffff;
        if (uVar19 < uVar15) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar23;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar19;
          uVar22 = SUB168(auVar3 / auVar1,0) << 0x20;
          for (lVar20 = uVar19 - SUB164(auVar3 / auVar1,0) * uVar23; lVar20 < 0;
              lVar20 = lVar20 + uVar23) {
            uVar22 = uVar22 - 0x100000000;
          }
          uVar10 = 0xffffffff;
          if ((ulong)(lVar20 << 0x20) < uVar15) {
            uVar10 = (ulong)(lVar20 << 0x20) / uVar23;
          }
          uVar10 = uVar10 | uVar22;
        }
        lVar20 = 0;
        if (1 < uVar10) {
          lVar20 = uVar10 - 2;
        }
        uVar19 = lVar20 * -((ulong)uVar17 << 0x26);
        iVar21 = iVar6 + -0x3e;
        bVar8 = 0x3e < iVar6;
        iVar6 = iVar21;
      } while (bVar8);
    }
    uVar23 = 0xffffffffffffffff;
    if (uVar19 < uVar15) {
      uVar10 = uVar15 >> 0x20;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar19;
      uVar23 = SUB168(auVar4 / auVar2,0) << 0x20;
      for (lVar20 = uVar19 - SUB164(auVar4 / auVar2,0) * uVar10; lVar20 < 0;
          lVar20 = lVar20 + uVar10) {
        uVar23 = uVar23 - 0x100000000;
      }
      if ((ulong)(lVar20 << 0x20) < uVar15) {
        uVar12 = (ulong)(lVar20 << 0x20) / uVar10;
      }
      uVar23 = uVar12 | uVar23;
    }
    uVar12 = 0;
    if (1 < uVar23) {
      uVar12 = uVar23 - 2;
    }
    uVar17 = uVar17 * 0x40;
    uVar14 = (uint)(uVar12 >> (-(char)iVar21 & 0x3fU));
    uVar18 = (int)((uVar19 >> 0x21) << ((char)iVar21 + 0x3fU & 0x3f)) - uVar17 * uVar14;
  }
LAB_00554fbb:
  uVar11 = uVar18 * -2;
  uVar14 = uVar14 - 1;
  do {
    uVar11 = uVar11 + uVar17 * 2;
    uVar14 = uVar14 + 1;
    uVar18 = uVar18 - uVar17;
  } while (-1 < (int)uVar18);
  if (((int)(uVar17 - uVar11) < 0) || ((bVar7 = 1, uVar17 == uVar11 && ((uVar14 & 1) == 0)))) {
    uVar18 = uVar17 + uVar18;
    bVar7 = (byte)(uVar18 >> 0x18);
    bVar13 = bVar7 >> 7;
    bVar7 = bVar7 >> 7;
    if (-1 < (int)uVar18) goto LAB_00554ffb;
  }
  bVar13 = bVar7;
  uVar18 = -uVar18;
LAB_00554ffb:
  if (uVar18 == 0) {
    uVar11 = 0x20;
  }
  else {
    uVar11 = 0x1f;
    if (uVar18 != 0) {
      for (; uVar18 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = uVar11 ^ 0x1f;
  }
  fVar9 = roundAndPackFloat32(bVar13 ^ (byte)(a >> 0x1f),uVar16 - (uVar11 - 1),
                              uVar18 << ((byte)(uVar11 - 1) & 0x1f),status);
  return fVar9;
}

Assistant:

float32 float32_rem(float32 a, float32 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint32_t aSig, bSig;
    uint32_t q;
    uint64_t aSig64, bSig64, q64;
    uint32_t alternateASig;
    int32_t sigMean;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    bSig = extractFloat32Frac( b );
    bExp = extractFloat32Exp( b );
    if ( aExp == 0xFF ) {
        if ( aSig || ( ( bExp == 0xFF ) && bSig ) ) {
            return propagateFloat32NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( bExp == 0xFF ) {
        if (bSig) {
            return propagateFloat32NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float32_default_nan(status);
        }
        normalizeFloat32Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig |= 0x00800000;
    bSig |= 0x00800000;
    if ( expDiff < 32 ) {
        aSig <<= 8;
        bSig <<= 8;
        if ( expDiff < 0 ) {
            if ( expDiff < -1 ) return a;
            aSig >>= 1;
        }
        q = ( bSig <= aSig );
        if ( q ) aSig -= bSig;
        if ( 0 < expDiff ) {
            q = ( ( (uint64_t) aSig )<<32 ) / bSig;
            q >>= 32 - expDiff;
            bSig >>= 2;
            aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
        }
        else {
            aSig >>= 2;
            bSig >>= 2;
        }
    }
    else {
        if ( bSig <= aSig ) aSig -= bSig;
        aSig64 = ( (uint64_t) aSig )<<40;
        bSig64 = ( (uint64_t) bSig )<<40;
        expDiff -= 64;
        while ( 0 < expDiff ) {
            q64 = estimateDiv128To64( aSig64, 0, bSig64 );
            q64 = ( 2 < q64 ) ? q64 - 2 : 0;
#ifdef _MSC_VER
            aSig64 = 0ULL - ( ( bSig * q64 )<<38 );
#else
            aSig64 = - ( ( bSig * q64 )<<38 );
#endif
            expDiff -= 62;
        }
        expDiff += 64;
        q64 = estimateDiv128To64( aSig64, 0, bSig64 );
        q64 = ( 2 < q64 ) ? q64 - 2 : 0;
        q = q64>>( 64 - expDiff );
        bSig <<= 6;
        aSig = ( ( aSig64>>33 )<<( expDiff - 1 ) ) - bSig * q;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int32_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int32_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0ULL - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat32(aSign ^ zSign, bExp, aSig, status);
}